

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR __thiscall NpyArray::LoadNPZ(NpyArray *this,string *filename,string *varname)

{
  bool bVar1;
  char *__filename;
  LPCSTR pcVar2;
  LPCSTR ret;
  anon_class_8_1_3fcf6588 local_78;
  function<void_()> local_70;
  undefined1 local_50 [8];
  ScopeExitRun closeFp;
  FILE *fp;
  string *varname_local;
  string *filename_local;
  NpyArray *this_local;
  
  Release(this);
  __filename = (char *)std::__cxx11::string::c_str();
  closeFp.functor._M_invoker = (_Invoker_type)fopen(__filename,"rb");
  if ((FILE *)closeFp.functor._M_invoker == (FILE *)0x0) {
    this_local = (NpyArray *)anon_var_dwarf_174;
  }
  else {
    local_78.fp = (FILE **)&closeFp.functor._M_invoker;
    std::function<void()>::
    function<NpyArray::LoadNPZ(std::__cxx11::string,std::__cxx11::string)::__0,void>
              ((function<void()> *)&local_70,&local_78);
    TScopeExitRun<std::function<void_()>_>::TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)local_50,&local_70);
    std::function<void_()>::~function(&local_70);
    do {
      pcVar2 = LoadArrayNPZ((FILE *)closeFp.functor._M_invoker,varname,this);
      if ((pcVar2 == (LPCSTR)0x0) && (bVar1 = IsEmpty(this), !bVar1)) {
        this_local = (NpyArray *)0x0;
        goto LAB_00161798;
      }
    } while (pcVar2 != (LPCSTR)0x1);
    this_local = (NpyArray *)anon_var_dwarf_1cc;
LAB_00161798:
    TScopeExitRun<std::function<void_()>_>::~TScopeExitRun
              ((TScopeExitRun<std::function<void_()>_> *)local_50);
  }
  return (LPCSTR)this_local;
}

Assistant:

LPCSTR NpyArray::LoadNPZ(std::string filename, std::string varname)
{
	Release();
	FILE* fp = fopen(filename.c_str(), "rb");
	if (!fp)
		return "error: unable to open file";
	const ScopeExitRun closeFp([&]() { fclose(fp); });
	while (true) {
		const LPCSTR ret = LoadArrayNPZ(fp, varname, *this);
		if (ret == NULL && !IsEmpty())
			return NULL;
		if (ret == (const char*)1)
			break;
	}
	return "error: variable name not found";
}